

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::detail::SocketStream::SocketStream
          (SocketStream *this,socket_t sock,time_t read_timeout_sec,time_t read_timeout_usec,
          time_t write_timeout_sec,time_t write_timeout_usec)

{
  time_t write_timeout_usec_local;
  time_t write_timeout_sec_local;
  time_t read_timeout_usec_local;
  time_t read_timeout_sec_local;
  socket_t sock_local;
  SocketStream *this_local;
  
  Stream::Stream(&this->super_Stream);
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__SocketStream_001cb458;
  this->sock_ = sock;
  this->read_timeout_sec_ = read_timeout_sec;
  this->read_timeout_usec_ = read_timeout_usec;
  this->write_timeout_sec_ = write_timeout_sec;
  this->write_timeout_usec_ = write_timeout_usec;
  return;
}

Assistant:

inline SocketStream::SocketStream(socket_t sock, time_t read_timeout_sec,
										  time_t read_timeout_usec,
										  time_t write_timeout_sec,
										  time_t write_timeout_usec)
				: sock_(sock), read_timeout_sec_(read_timeout_sec),
				  read_timeout_usec_(read_timeout_usec),
				  write_timeout_sec_(write_timeout_sec),
				  write_timeout_usec_(write_timeout_usec) {}